

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::HttpHeaders::Header>::dispose(ArrayBuilder<kj::HttpHeaders::Header> *this)

{
  Header *firstElement;
  RemoveConst<kj::HttpHeaders::Header> *pRVar1;
  Header *pHVar2;
  Header *endCopy;
  Header *posCopy;
  Header *ptrCopy;
  ArrayBuilder<kj::HttpHeaders::Header> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pHVar2 = this->endPtr;
  if (firstElement != (Header *)0x0) {
    this->ptr = (Header *)0x0;
    this->pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    this->endPtr = (Header *)0x0;
    ArrayDisposer::dispose<kj::HttpHeaders::Header>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 5,
               (long)pHVar2 - (long)firstElement >> 5);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }